

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

ArrayObject * __thiscall Js::DynamicObject::EnsureObjectArray(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  JavascriptArray *objArray;
  undefined4 *puVar3;
  
  bVar2 = HasObjectArray(this);
  if (!bVar2) {
    objArray = JavascriptLibrary::CreateArray
                         ((((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                            super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase
                          ).javascriptLibrary,0,4);
    SetObjectArray(this,&objArray->super_ArrayObject);
  }
  bVar2 = HasObjectArray(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0xb9,"(HasObjectArray())","HasObjectArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (ArrayObject *)this->field_1;
}

Assistant:

ArrayObject* DynamicObject::EnsureObjectArray()
    {
        if (!HasObjectArray())
        {
            ScriptContext* scriptContext = GetScriptContext();
            ArrayObject* objArray = scriptContext->GetLibrary()->CreateArray(0, SparseArraySegmentBase::SMALL_CHUNK_SIZE);
            SetObjectArray(objArray);
        }
        Assert(HasObjectArray());
        return GetObjectArrayOrFlagsAsArray();
    }